

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApprovalTestNamer.cpp
# Opt level: O1

TestName * ApprovalTests::ApprovalTestNamer::currentTest(TestName *value)

{
  runtime_error *this;
  
  if (value != (TestName *)0x0) {
    currentTest::staticValue = value;
  }
  if (currentTest::staticValue != (TestName *)0x0) {
    return currentTest::staticValue;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::runtime_error::runtime_error(this,"The variable in currentTest() is not initialised");
  __cxa_throw(this,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

TestName& ApprovalTestNamer::currentTest(TestName* value)
    {
        static TestName* staticValue;
        if (value != nullptr)
        {
            staticValue = value;
        }
        if (staticValue == nullptr)
        {
            throw std::runtime_error("The variable in currentTest() is not initialised");
        }
        return *staticValue;
    }